

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  long lVar1;
  uint uVar2;
  p_ply_element ptVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = (uint)ply->nelements;
  ptVar3 = ply->element;
  lVar4 = 0;
  do {
    lVar6 = lVar4;
    if ((ulong)(~((int)uVar2 >> 0x1f) & uVar2) * 0x118 + 0x118 == lVar6 + 0x118) {
      return 0;
    }
    iVar5 = strcmp(ptVar3->name + lVar6,element_name);
    lVar4 = lVar6 + 0x118;
  } while (iVar5 != 0);
  if (ptVar3 != (p_ply_element)0x0) {
    uVar2 = *(uint *)((long)&ptVar3->nproperties + lVar6);
    lVar4 = *(long *)((long)&ptVar3->property + lVar6);
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 0x128;
      if ((ulong)(~((int)uVar2 >> 0x1f) & uVar2) * 0x128 + 0x128 == lVar1) {
        return 0;
      }
      iVar5 = strcmp((char *)(lVar7 + lVar4),property_name);
      lVar7 = lVar1;
    } while (iVar5 != 0);
    if (lVar4 != 0) {
      *(p_ply_read_cb *)(lVar4 + -0x18 + lVar1) = read_cb;
      *(void **)(lVar4 + -0x10 + lVar1) = pdata;
      *(long *)(lVar4 + -8 + lVar1) = idata;
      return (long)*(int *)((long)&ptVar3->ninstances + lVar6);
    }
  }
  return 0;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
                     const char *property_name, p_ply_read_cb read_cb,
                     void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int)element->ninstances;
}